

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

iterator * __thiscall
skiplist<int,_std::less<int>_>::find
          (iterator *__return_storage_ptr__,skiplist<int,_std::less<int>_> *this,int value)

{
  pointer ppSVar1;
  SLNode<int> **ppSVar2;
  SLNode<int> *pSVar3;
  SLNode<int> *node_;
  
  ppSVar1 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppSVar1) {
    ppSVar2 = ppSVar1 + -1;
    while (node_ = *ppSVar2, node_->down != (SLNode<int> *)0x0) {
      do {
        pSVar3 = node_;
        node_ = pSVar3->next;
        if (node_ == (SLNode<int> *)0x0) break;
      } while (node_->val < value);
      ppSVar2 = &pSVar3->down;
    }
    do {
      node_ = node_->next;
      if (node_ == (SLNode<int> *)0x0) goto LAB_00103032;
    } while (node_->val < value);
    if (node_->val == value) {
      cake_iterator<false>::cake_iterator(__return_storage_ptr__,node_);
      return __return_storage_ptr__;
    }
  }
LAB_00103032:
  __return_storage_ptr__->node = (SLNode<int> *)0x0;
  __return_storage_ptr__->node_count_ = 0;
  __return_storage_ptr__->node_count_ref_ = 0;
  __return_storage_ptr__->reverse_ = false;
  return __return_storage_ptr__;
}

Assistant:

typename skiplist<T, X>::iterator skiplist<T, X>::find(T value) {
    // Same algorithm as erase, but without erasing anything ;)
    if(key.empty())
        return end();

    // Start from top left
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val, value))
            follow = follow->next;
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val, value))
        follow = follow->next;

    // If not exist, leave
    if(!follow->next || !_420_is_equal(follow->next->val, value, compare))
        return end();

    // This is the node for sure
    follow = follow->next;
    return iterator(follow);
}